

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

bool mjs::to_boolean(value *v)

{
  string *this;
  wostream *os;
  bool bVar1;
  double dVar2;
  wstring_view wVar3;
  wostringstream _woss;
  wstring_view local_198;
  wostringstream local_188 [376];
  
  switch(v->type_) {
  case boolean:
    bVar1 = value::boolean_value(v);
    return bVar1;
  case number:
    dVar2 = value::number_value(v);
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar2 = value::number_value(v);
      return !NAN(dVar2);
    }
  case undefined:
  case null:
    bVar1 = false;
    break;
  case string:
    this = value::string_value(v);
    wVar3 = string::view(this);
    bVar1 = wVar3._M_len != 0;
    break;
  case object:
    bVar1 = true;
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_188);
    os = std::operator<<((wostream *)local_188,"Not implemented: ");
    operator<<(os,v->type_);
    std::__cxx11::wstringbuf::str();
    throw_runtime_error(&local_198,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                        ,0x97);
  }
  return bVar1;
}

Assistant:

bool to_boolean(const value& v) {
    switch (v.type()) {
    case value_type::undefined: return false;
    case value_type::null:      return false;
    case value_type::boolean:   return v.boolean_value();
    case value_type::number:    return v.number_value() != 0 && !std::isnan(v.number_value());
    case value_type::string:    return !v.string_value().view().empty();
    case value_type::object:    return true;
    case value_type::reference: break;
    }
    NOT_IMPLEMENTED(v.type());
}